

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O1

void __thiscall Snes_Spc::cpu_write(Snes_Spc *this,int data,int addr,rel_time_t time)

{
  uint addr_00;
  
  (this->m).ram.ram[addr] = (uint8_t)data;
  if (0xef < addr) {
    if (addr < 0x100) {
      addr_00 = addr - 0xf0;
      (this->m).smp_regs[0][addr_00] = (uint8_t)data;
      if (addr - 0xf8U < 0xfffffffc && addr_00 != 2) {
        cpu_write_smp_reg(this,data,time,addr_00);
        return;
      }
    }
    else if (0xffbf < addr) {
      cpu_write_high(this,data,addr + -0xffc0,time);
      return;
    }
  }
  return;
}

Assistant:

void Snes_Spc::cpu_write( int data, int addr, rel_time_t time )
{
	MEM_ACCESS( time, addr )
	
	// RAM
	RAM [addr] = (uint8_t) data;
	int reg = addr - 0xF0;
	if ( reg >= 0 ) // 64%
	{
		// $F0-$FF
		if ( reg < reg_count ) // 87%
		{
			REGS [reg] = (uint8_t) data;
			
			// Ports
			#ifdef SPC_PORT_WRITE_HOOK
				if ( (unsigned) (reg - r_cpuio0) < port_count )
					SPC_PORT_WRITE_HOOK( m.spc_time + time, (reg - r_cpuio0),
							(uint8_t) data, &REGS [r_cpuio0] );
			#endif
			
			// Registers other than $F2 and $F4-$F7
			if ( reg != 2 && (reg < 4 || reg > 7) ) // 36%
				cpu_write_smp_reg( data, time, reg );
		}
		// High mem/address wrap-around
		else
		{
			reg -= rom_addr - 0xF0;
			if ( reg >= 0 ) // 1% in IPL ROM area or address wrapped around
				cpu_write_high( data, reg, time );
		}
	}
}